

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * psd_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uchar uVar17;
  uint32 uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint32 x_00;
  uint32 uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uchar *puVar29;
  int iVar30;
  uchar *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  int iVar87;
  int iVar94;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  uchar *local_78;
  
  uVar18 = get32(s);
  if (uVar18 == 0x38425053) {
    iVar19 = get8(s);
    iVar20 = get8(s);
    if (iVar20 + iVar19 * 0x100 == 1) {
      if ((FILE *)s->img_file == (FILE *)0x0) {
        s->img_buffer = s->img_buffer + 6;
      }
      else {
        fseek((FILE *)s->img_file,6,1);
      }
      iVar19 = get8(s);
      iVar20 = get8(s);
      uVar21 = iVar20 + iVar19 * 0x100;
      if (uVar21 < 0x11) {
        uVar18 = get32(s);
        x_00 = get32(s);
        iVar19 = get8(s);
        iVar20 = get8(s);
        if (iVar20 + iVar19 * 0x100 == 8) {
          iVar19 = get8(s);
          iVar20 = get8(s);
          if (iVar20 + iVar19 * 0x100 == 3) {
            uVar22 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar22;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar22,1);
            }
            uVar22 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar22;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar22,1);
            }
            uVar22 = get32(s);
            if ((FILE *)s->img_file == (FILE *)0x0) {
              s->img_buffer = s->img_buffer + (int)uVar22;
            }
            else {
              fseek((FILE *)s->img_file,(long)(int)uVar22,1);
            }
            iVar19 = get8(s);
            iVar20 = get8(s);
            iVar20 = iVar20 + iVar19 * 0x100;
            if (iVar20 < 2) {
              uVar23 = uVar18 * x_00;
              local_78 = (uchar *)malloc((long)(int)(uVar23 * 4));
              if (local_78 == (uchar *)0x0) {
                failure_reason = "Out of memory";
              }
              else {
                if (iVar20 == 0) {
                  lVar28 = (ulong)uVar23 - 1;
                  auVar37._8_4_ = (int)lVar28;
                  auVar37._0_8_ = lVar28;
                  auVar37._12_4_ = (int)((ulong)lVar28 >> 0x20);
                  uVar26 = 0;
                  puVar29 = local_78;
                  auVar104 = _DAT_001111c0;
                  do {
                    if (uVar21 < uVar26) {
                      if (0 < (int)uVar23) {
                        uVar17 = -(uVar26 == 3);
                        uVar27 = 0;
                        do {
                          auVar103._8_4_ = (int)uVar27;
                          auVar103._0_8_ = uVar27;
                          auVar103._12_4_ = (int)(uVar27 >> 0x20);
                          auVar53 = auVar37 ^ auVar104;
                          auVar57 = (auVar103 | _DAT_001111b0) ^ auVar104;
                          iVar19 = auVar53._0_4_;
                          iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                          iVar20 = auVar53._4_4_;
                          auVar80._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                          iVar25 = auVar53._8_4_;
                          iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                          iVar30 = auVar53._12_4_;
                          auVar80._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                          auVar44._4_4_ = iVar87;
                          auVar44._0_4_ = iVar87;
                          auVar44._8_4_ = iVar94;
                          auVar44._12_4_ = iVar94;
                          auVar95 = pshuflw(in_XMM5,auVar44,0xe8);
                          auVar58._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                          auVar58._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                          auVar58._0_4_ = auVar58._4_4_;
                          auVar58._8_4_ = auVar58._12_4_;
                          auVar102 = pshuflw(in_XMM6,auVar58,0xe8);
                          auVar80._0_4_ = auVar80._4_4_;
                          auVar80._8_4_ = auVar80._12_4_;
                          auVar57 = pshuflw(auVar95,auVar80,0xe8);
                          auVar53._8_4_ = 0xffffffff;
                          auVar53._0_8_ = 0xffffffffffffffff;
                          auVar53._12_4_ = 0xffffffff;
                          auVar53 = (auVar57 | auVar102 & auVar95) ^ auVar53;
                          auVar53 = packssdw(auVar53,auVar53);
                          if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            puVar29[uVar27 * 4] = uVar17;
                          }
                          auVar80 = auVar58 & auVar44 | auVar80;
                          auVar53 = packssdw(auVar80,auVar80);
                          auVar57._8_4_ = 0xffffffff;
                          auVar57._0_8_ = 0xffffffffffffffff;
                          auVar57._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar57,auVar53 ^ auVar57);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53._0_4_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 4] = uVar17;
                          }
                          auVar53 = (auVar103 | _DAT_001111a0) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar53._0_4_);
                          auVar88._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar53._8_4_);
                          auVar88._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                          auVar39._4_4_ = iVar87;
                          auVar39._0_4_ = iVar87;
                          auVar39._8_4_ = iVar94;
                          auVar39._12_4_ = iVar94;
                          auVar71._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                          auVar71._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                          auVar71._0_4_ = auVar71._4_4_;
                          auVar71._8_4_ = auVar71._12_4_;
                          auVar88._0_4_ = auVar88._4_4_;
                          auVar88._8_4_ = auVar88._12_4_;
                          auVar53 = auVar71 & auVar39 | auVar88;
                          auVar53 = packssdw(auVar53,auVar53);
                          auVar10._8_4_ = 0xffffffff;
                          auVar10._0_8_ = 0xffffffffffffffff;
                          auVar10._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar10,auVar53 ^ auVar10);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
                            puVar29[uVar27 * 4 + 8] = uVar17;
                          }
                          auVar57 = pshufhw(auVar39,auVar39,0x84);
                          auVar80 = pshufhw(auVar71,auVar71,0x84);
                          auVar58 = pshufhw(auVar57,auVar88,0x84);
                          auVar40._8_4_ = 0xffffffff;
                          auVar40._0_8_ = 0xffffffffffffffff;
                          auVar40._12_4_ = 0xffffffff;
                          auVar40 = (auVar58 | auVar80 & auVar57) ^ auVar40;
                          auVar57 = packssdw(auVar40,auVar40);
                          auVar57 = packsswb(auVar57,auVar57);
                          if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0xc] = uVar17;
                          }
                          auVar57 = (auVar103 | _DAT_00111190) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                          auVar42._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                          auVar42._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                          auVar72._4_4_ = iVar87;
                          auVar72._0_4_ = iVar87;
                          auVar72._8_4_ = iVar94;
                          auVar72._12_4_ = iVar94;
                          auVar53 = pshuflw(auVar53,auVar72,0xe8);
                          auVar41._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                          auVar41._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                          auVar41._0_4_ = auVar41._4_4_;
                          auVar41._8_4_ = auVar41._12_4_;
                          auVar58 = pshuflw(auVar102 & auVar95,auVar41,0xe8);
                          auVar42._0_4_ = auVar42._4_4_;
                          auVar42._8_4_ = auVar42._12_4_;
                          auVar57 = pshuflw(auVar53,auVar42,0xe8);
                          auVar95._8_4_ = 0xffffffff;
                          auVar95._0_8_ = 0xffffffffffffffff;
                          auVar95._12_4_ = 0xffffffff;
                          auVar95 = (auVar57 | auVar58 & auVar53) ^ auVar95;
                          auVar57 = packssdw(auVar95,auVar95);
                          auVar57 = packsswb(auVar57,auVar57);
                          if ((auVar57 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            puVar29[uVar27 * 4 + 0x10] = uVar17;
                          }
                          auVar42 = auVar41 & auVar72 | auVar42;
                          auVar57 = packssdw(auVar42,auVar42);
                          auVar102._8_4_ = 0xffffffff;
                          auVar102._0_8_ = 0xffffffffffffffff;
                          auVar102._12_4_ = 0xffffffff;
                          auVar57 = packssdw(auVar57 ^ auVar102,auVar57 ^ auVar102);
                          auVar57 = packsswb(auVar57,auVar57);
                          if ((auVar57._4_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x14] = uVar17;
                          }
                          auVar57 = (auVar103 | _DAT_00111180) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                          auVar89._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                          auVar89._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                          auVar43._4_4_ = iVar87;
                          auVar43._0_4_ = iVar87;
                          auVar43._8_4_ = iVar94;
                          auVar43._12_4_ = iVar94;
                          auVar73._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                          auVar73._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                          auVar73._0_4_ = auVar73._4_4_;
                          auVar73._8_4_ = auVar73._12_4_;
                          auVar89._0_4_ = auVar89._4_4_;
                          auVar89._8_4_ = auVar89._12_4_;
                          auVar57 = auVar73 & auVar43 | auVar89;
                          auVar57 = packssdw(auVar57,auVar57);
                          auVar11._8_4_ = 0xffffffff;
                          auVar11._0_8_ = 0xffffffffffffffff;
                          auVar11._12_4_ = 0xffffffff;
                          auVar57 = packssdw(auVar57 ^ auVar11,auVar57 ^ auVar11);
                          auVar57 = packsswb(auVar57,auVar57);
                          if ((auVar57 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            puVar29[uVar27 * 4 + 0x18] = uVar17;
                          }
                          auVar80 = pshufhw(auVar43,auVar43,0x84);
                          auVar95 = pshufhw(auVar73,auVar73,0x84);
                          auVar44 = pshufhw(auVar80,auVar89,0x84);
                          auVar45._8_4_ = 0xffffffff;
                          auVar45._0_8_ = 0xffffffffffffffff;
                          auVar45._12_4_ = 0xffffffff;
                          auVar45 = (auVar44 | auVar95 & auVar80) ^ auVar45;
                          auVar80 = packssdw(auVar45,auVar45);
                          auVar80 = packsswb(auVar80,auVar80);
                          if ((auVar80._6_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x1c] = uVar17;
                          }
                          auVar80 = (auVar103 | _DAT_00111170) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar80._0_4_);
                          auVar47._4_4_ = -(uint)(iVar20 < auVar80._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar80._8_4_);
                          auVar47._12_4_ = -(uint)(iVar30 < auVar80._12_4_);
                          auVar74._4_4_ = iVar87;
                          auVar74._0_4_ = iVar87;
                          auVar74._8_4_ = iVar94;
                          auVar74._12_4_ = iVar94;
                          auVar57 = pshuflw(auVar57,auVar74,0xe8);
                          auVar46._4_4_ = -(uint)(auVar80._4_4_ == iVar20);
                          auVar46._12_4_ = -(uint)(auVar80._12_4_ == iVar30);
                          auVar46._0_4_ = auVar46._4_4_;
                          auVar46._8_4_ = auVar46._12_4_;
                          auVar58 = pshuflw(auVar58 & auVar53,auVar46,0xe8);
                          auVar47._0_4_ = auVar47._4_4_;
                          auVar47._8_4_ = auVar47._12_4_;
                          auVar53 = pshuflw(auVar57,auVar47,0xe8);
                          auVar96._8_4_ = 0xffffffff;
                          auVar96._0_8_ = 0xffffffffffffffff;
                          auVar96._12_4_ = 0xffffffff;
                          auVar96 = (auVar53 | auVar58 & auVar57) ^ auVar96;
                          auVar53 = packssdw(auVar96,auVar96);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            puVar29[uVar27 * 4 + 0x20] = uVar17;
                          }
                          auVar47 = auVar46 & auVar74 | auVar47;
                          auVar53 = packssdw(auVar47,auVar47);
                          auVar12._8_4_ = 0xffffffff;
                          auVar12._0_8_ = 0xffffffffffffffff;
                          auVar12._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar12,auVar53 ^ auVar12);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53._8_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x24] = uVar17;
                          }
                          auVar53 = (auVar103 | _DAT_00111160) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar53._0_4_);
                          auVar90._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar53._8_4_);
                          auVar90._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                          auVar48._4_4_ = iVar87;
                          auVar48._0_4_ = iVar87;
                          auVar48._8_4_ = iVar94;
                          auVar48._12_4_ = iVar94;
                          auVar75._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                          auVar75._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                          auVar75._0_4_ = auVar75._4_4_;
                          auVar75._8_4_ = auVar75._12_4_;
                          auVar90._0_4_ = auVar90._4_4_;
                          auVar90._8_4_ = auVar90._12_4_;
                          auVar53 = auVar75 & auVar48 | auVar90;
                          auVar53 = packssdw(auVar53,auVar53);
                          auVar13._8_4_ = 0xffffffff;
                          auVar13._0_8_ = 0xffffffffffffffff;
                          auVar13._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar13,auVar53 ^ auVar13);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                            puVar29[uVar27 * 4 + 0x28] = uVar17;
                          }
                          auVar80 = pshufhw(auVar48,auVar48,0x84);
                          auVar95 = pshufhw(auVar75,auVar75,0x84);
                          auVar44 = pshufhw(auVar80,auVar90,0x84);
                          auVar49._8_4_ = 0xffffffff;
                          auVar49._0_8_ = 0xffffffffffffffff;
                          auVar49._12_4_ = 0xffffffff;
                          auVar49 = (auVar44 | auVar95 & auVar80) ^ auVar49;
                          auVar80 = packssdw(auVar49,auVar49);
                          auVar80 = packsswb(auVar80,auVar80);
                          if ((auVar80._10_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x2c] = uVar17;
                          }
                          auVar80 = (auVar103 | _DAT_00111150) ^ auVar104;
                          iVar87 = -(uint)(iVar19 < auVar80._0_4_);
                          auVar51._4_4_ = -(uint)(iVar20 < auVar80._4_4_);
                          iVar94 = -(uint)(iVar25 < auVar80._8_4_);
                          auVar51._12_4_ = -(uint)(iVar30 < auVar80._12_4_);
                          auVar76._4_4_ = iVar87;
                          auVar76._0_4_ = iVar87;
                          auVar76._8_4_ = iVar94;
                          auVar76._12_4_ = iVar94;
                          auVar53 = pshuflw(auVar53,auVar76,0xe8);
                          auVar50._4_4_ = -(uint)(auVar80._4_4_ == iVar20);
                          auVar50._12_4_ = -(uint)(auVar80._12_4_ == iVar30);
                          auVar50._0_4_ = auVar50._4_4_;
                          auVar50._8_4_ = auVar50._12_4_;
                          in_XMM6 = pshuflw(auVar58 & auVar57,auVar50,0xe8);
                          in_XMM6 = in_XMM6 & auVar53;
                          auVar51._0_4_ = auVar51._4_4_;
                          auVar51._8_4_ = auVar51._12_4_;
                          auVar53 = pshuflw(auVar53,auVar51,0xe8);
                          auVar97._8_4_ = 0xffffffff;
                          auVar97._0_8_ = 0xffffffffffffffff;
                          auVar97._12_4_ = 0xffffffff;
                          auVar97 = (auVar53 | in_XMM6) ^ auVar97;
                          auVar53 = packssdw(auVar97,auVar97);
                          in_XMM5 = packsswb(auVar53,auVar53);
                          if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            puVar29[uVar27 * 4 + 0x30] = uVar17;
                          }
                          auVar51 = auVar50 & auVar76 | auVar51;
                          auVar53 = packssdw(auVar51,auVar51);
                          auVar14._8_4_ = 0xffffffff;
                          auVar14._0_8_ = 0xffffffffffffffff;
                          auVar14._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar14,auVar53 ^ auVar14);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53._12_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x34] = uVar17;
                          }
                          auVar53 = (auVar103 | _DAT_00111140) ^ auVar104;
                          auVar77._0_4_ = -(uint)(iVar19 < auVar53._0_4_);
                          auVar77._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                          auVar77._8_4_ = -(uint)(iVar25 < auVar53._8_4_);
                          auVar77._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                          auVar52._4_4_ = auVar77._0_4_;
                          auVar52._0_4_ = auVar77._0_4_;
                          auVar52._8_4_ = auVar77._8_4_;
                          auVar52._12_4_ = auVar77._8_4_;
                          auVar32._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                          auVar32._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                          auVar32._0_4_ = auVar32._4_4_;
                          auVar32._8_4_ = auVar32._12_4_;
                          auVar36._4_4_ = auVar77._4_4_;
                          auVar36._0_4_ = auVar77._4_4_;
                          auVar36._8_4_ = auVar77._12_4_;
                          auVar36._12_4_ = auVar77._12_4_;
                          auVar53 = packssdw(auVar77,auVar32 & auVar52 | auVar36);
                          auVar15._8_4_ = 0xffffffff;
                          auVar15._0_8_ = 0xffffffffffffffff;
                          auVar15._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 ^ auVar15,auVar53 ^ auVar15);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            puVar29[uVar27 * 4 + 0x38] = uVar17;
                          }
                          auVar57 = pshufhw(auVar52,auVar52,0x84);
                          auVar53 = pshufhw(auVar32,auVar32,0x84);
                          auVar103 = pshufhw(auVar36,auVar36,0x84);
                          auVar16._8_4_ = 0xffffffff;
                          auVar16._0_8_ = 0xffffffffffffffff;
                          auVar16._12_4_ = 0xffffffff;
                          auVar53 = packssdw(auVar53 & auVar57,
                                             (auVar103 | auVar53 & auVar57) ^ auVar16);
                          auVar53 = packsswb(auVar53,auVar53);
                          if ((auVar53._14_2_ >> 8 & 1) != 0) {
                            puVar29[uVar27 * 4 + 0x3c] = uVar17;
                          }
                          uVar27 = uVar27 + 0x10;
                        } while ((uVar23 + 0xf & 0xfffffff0) != uVar27);
                      }
                    }
                    else if (0 < (int)uVar23) {
                      lVar28 = 0;
                      do {
                        iVar19 = get8(s);
                        auVar104 = _DAT_001111c0;
                        puVar29[lVar28 * 4] = (uchar)iVar19;
                        lVar28 = lVar28 + 1;
                      } while (uVar23 != (uint)lVar28);
                    }
                    uVar26 = uVar26 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar26 != 4);
                }
                else {
                  lVar28 = (long)(int)(uVar21 * uVar18 * 2);
                  if ((FILE *)s->img_file == (FILE *)0x0) {
                    s->img_buffer = s->img_buffer + lVar28;
                  }
                  else {
                    fseek((FILE *)s->img_file,lVar28,1);
                  }
                  lVar28 = (ulong)uVar23 - 1;
                  auVar33._8_4_ = (int)lVar28;
                  auVar33._0_8_ = lVar28;
                  auVar33._12_4_ = (int)((ulong)lVar28 >> 0x20);
                  puVar29 = local_78 + 0x3c;
                  uVar26 = 0;
                  auVar104 = _DAT_001111c0;
                  do {
                    if (uVar26 < uVar21) {
                      if (0 < (int)uVar23) {
                        puVar31 = local_78 + uVar26;
                        iVar19 = 0;
                        do {
                          uVar24 = get8(s);
                          if (uVar24 != 0x80) {
                            if ((int)uVar24 < 0x80) {
                              iVar20 = uVar24 + 1;
                              iVar19 = iVar20 + iVar19;
                              for (; iVar20 != 0; iVar20 = iVar20 + -1) {
                                iVar25 = get8(s);
                                *puVar31 = (uchar)iVar25;
                                puVar31 = puVar31 + 4;
                              }
                            }
                            else {
                              iVar30 = (uVar24 ^ 0xff) + 2;
                              iVar25 = get8(s);
                              iVar20 = iVar30;
                              do {
                                *puVar31 = (uchar)iVar25;
                                puVar31 = puVar31 + 4;
                                iVar20 = iVar20 + -1;
                              } while (iVar20 != 0);
                              iVar19 = iVar30 + iVar19;
                            }
                          }
                          auVar104 = _DAT_001111c0;
                        } while (iVar19 < (int)uVar23);
                      }
                    }
                    else if (0 < (int)uVar23) {
                      uVar17 = -(uVar26 == 3);
                      uVar27 = 0;
                      do {
                        auVar34._8_4_ = (int)uVar27;
                        auVar34._0_8_ = uVar27;
                        auVar34._12_4_ = (int)(uVar27 >> 0x20);
                        auVar37 = auVar33 ^ auVar104;
                        auVar53 = (auVar34 | _DAT_001111b0) ^ auVar104;
                        iVar19 = auVar37._0_4_;
                        iVar87 = -(uint)(iVar19 < auVar53._0_4_);
                        iVar20 = auVar37._4_4_;
                        auVar55._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                        iVar25 = auVar37._8_4_;
                        iVar94 = -(uint)(iVar25 < auVar53._8_4_);
                        iVar30 = auVar37._12_4_;
                        auVar55._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                        auVar78._4_4_ = iVar87;
                        auVar78._0_4_ = iVar87;
                        auVar78._8_4_ = iVar94;
                        auVar78._12_4_ = iVar94;
                        auVar37 = pshuflw(in_XMM5,auVar78,0xe8);
                        auVar54._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                        auVar54._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                        auVar54._0_4_ = auVar54._4_4_;
                        auVar54._8_4_ = auVar54._12_4_;
                        auVar103 = pshuflw(in_XMM6,auVar54,0xe8);
                        auVar55._0_4_ = auVar55._4_4_;
                        auVar55._8_4_ = auVar55._12_4_;
                        auVar53 = pshuflw(auVar37,auVar55,0xe8);
                        auVar98._8_4_ = 0xffffffff;
                        auVar98._0_8_ = 0xffffffffffffffff;
                        auVar98._12_4_ = 0xffffffff;
                        auVar98 = (auVar53 | auVar103 & auVar37) ^ auVar98;
                        auVar53 = packssdw(auVar98,auVar98);
                        if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          puVar29[uVar27 * 4 + -0x3c] = uVar17;
                        }
                        auVar55 = auVar54 & auVar78 | auVar55;
                        auVar53 = packssdw(auVar55,auVar55);
                        auVar1._8_4_ = 0xffffffff;
                        auVar1._0_8_ = 0xffffffffffffffff;
                        auVar1._12_4_ = 0xffffffff;
                        auVar53 = packssdw(auVar53 ^ auVar1,auVar53 ^ auVar1);
                        auVar53 = packsswb(auVar53,auVar53);
                        if ((auVar53._0_4_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x38] = uVar17;
                        }
                        auVar53 = (auVar34 | _DAT_001111a0) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar53._0_4_);
                        auVar91._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar53._8_4_);
                        auVar91._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                        auVar56._4_4_ = iVar87;
                        auVar56._0_4_ = iVar87;
                        auVar56._8_4_ = iVar94;
                        auVar56._12_4_ = iVar94;
                        auVar79._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                        auVar79._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                        auVar79._0_4_ = auVar79._4_4_;
                        auVar79._8_4_ = auVar79._12_4_;
                        auVar91._0_4_ = auVar91._4_4_;
                        auVar91._8_4_ = auVar91._12_4_;
                        auVar53 = auVar79 & auVar56 | auVar91;
                        auVar53 = packssdw(auVar53,auVar53);
                        auVar2._8_4_ = 0xffffffff;
                        auVar2._0_8_ = 0xffffffffffffffff;
                        auVar2._12_4_ = 0xffffffff;
                        auVar53 = packssdw(auVar53 ^ auVar2,auVar53 ^ auVar2);
                        auVar53 = packsswb(auVar53,auVar53);
                        if ((auVar53._0_4_ >> 0x10 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x34] = uVar17;
                        }
                        auVar57 = pshufhw(auVar56,auVar56,0x84);
                        auVar80 = pshufhw(auVar79,auVar79,0x84);
                        auVar58 = pshufhw(auVar57,auVar91,0x84);
                        auVar59._8_4_ = 0xffffffff;
                        auVar59._0_8_ = 0xffffffffffffffff;
                        auVar59._12_4_ = 0xffffffff;
                        auVar59 = (auVar58 | auVar80 & auVar57) ^ auVar59;
                        auVar57 = packssdw(auVar59,auVar59);
                        auVar57 = packsswb(auVar57,auVar57);
                        if ((auVar57._0_4_ >> 0x18 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x30] = uVar17;
                        }
                        auVar57 = (auVar34 | _DAT_00111190) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                        auVar61._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                        auVar61._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                        auVar81._4_4_ = iVar87;
                        auVar81._0_4_ = iVar87;
                        auVar81._8_4_ = iVar94;
                        auVar81._12_4_ = iVar94;
                        auVar53 = pshuflw(auVar53,auVar81,0xe8);
                        auVar60._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                        auVar60._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                        auVar60._0_4_ = auVar60._4_4_;
                        auVar60._8_4_ = auVar60._12_4_;
                        auVar103 = pshuflw(auVar103 & auVar37,auVar60,0xe8);
                        auVar61._0_4_ = auVar61._4_4_;
                        auVar61._8_4_ = auVar61._12_4_;
                        auVar37 = pshuflw(auVar53,auVar61,0xe8);
                        auVar99._8_4_ = 0xffffffff;
                        auVar99._0_8_ = 0xffffffffffffffff;
                        auVar99._12_4_ = 0xffffffff;
                        auVar99 = (auVar37 | auVar103 & auVar53) ^ auVar99;
                        auVar37 = packssdw(auVar99,auVar99);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          puVar29[uVar27 * 4 + -0x2c] = uVar17;
                        }
                        auVar61 = auVar60 & auVar81 | auVar61;
                        auVar37 = packssdw(auVar61,auVar61);
                        auVar3._8_4_ = 0xffffffff;
                        auVar3._0_8_ = 0xffffffffffffffff;
                        auVar3._12_4_ = 0xffffffff;
                        auVar37 = packssdw(auVar37 ^ auVar3,auVar37 ^ auVar3);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37._4_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x28] = uVar17;
                        }
                        auVar37 = (auVar34 | _DAT_00111180) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar37._0_4_);
                        auVar92._4_4_ = -(uint)(iVar20 < auVar37._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar37._8_4_);
                        auVar92._12_4_ = -(uint)(iVar30 < auVar37._12_4_);
                        auVar62._4_4_ = iVar87;
                        auVar62._0_4_ = iVar87;
                        auVar62._8_4_ = iVar94;
                        auVar62._12_4_ = iVar94;
                        auVar82._4_4_ = -(uint)(auVar37._4_4_ == iVar20);
                        auVar82._12_4_ = -(uint)(auVar37._12_4_ == iVar30);
                        auVar82._0_4_ = auVar82._4_4_;
                        auVar82._8_4_ = auVar82._12_4_;
                        auVar92._0_4_ = auVar92._4_4_;
                        auVar92._8_4_ = auVar92._12_4_;
                        auVar37 = auVar82 & auVar62 | auVar92;
                        auVar37 = packssdw(auVar37,auVar37);
                        auVar4._8_4_ = 0xffffffff;
                        auVar4._0_8_ = 0xffffffffffffffff;
                        auVar4._12_4_ = 0xffffffff;
                        auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          puVar29[uVar27 * 4 + -0x24] = uVar17;
                        }
                        auVar57 = pshufhw(auVar62,auVar62,0x84);
                        auVar80 = pshufhw(auVar82,auVar82,0x84);
                        auVar58 = pshufhw(auVar57,auVar92,0x84);
                        auVar63._8_4_ = 0xffffffff;
                        auVar63._0_8_ = 0xffffffffffffffff;
                        auVar63._12_4_ = 0xffffffff;
                        auVar63 = (auVar58 | auVar80 & auVar57) ^ auVar63;
                        auVar57 = packssdw(auVar63,auVar63);
                        auVar57 = packsswb(auVar57,auVar57);
                        if ((auVar57._6_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x20] = uVar17;
                        }
                        auVar57 = (auVar34 | _DAT_00111170) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                        auVar65._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                        auVar65._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                        auVar83._4_4_ = iVar87;
                        auVar83._0_4_ = iVar87;
                        auVar83._8_4_ = iVar94;
                        auVar83._12_4_ = iVar94;
                        auVar37 = pshuflw(auVar37,auVar83,0xe8);
                        auVar64._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                        auVar64._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                        auVar64._0_4_ = auVar64._4_4_;
                        auVar64._8_4_ = auVar64._12_4_;
                        auVar103 = pshuflw(auVar103 & auVar53,auVar64,0xe8);
                        auVar65._0_4_ = auVar65._4_4_;
                        auVar65._8_4_ = auVar65._12_4_;
                        auVar53 = pshuflw(auVar37,auVar65,0xe8);
                        auVar100._8_4_ = 0xffffffff;
                        auVar100._0_8_ = 0xffffffffffffffff;
                        auVar100._12_4_ = 0xffffffff;
                        auVar100 = (auVar53 | auVar103 & auVar37) ^ auVar100;
                        auVar53 = packssdw(auVar100,auVar100);
                        auVar53 = packsswb(auVar53,auVar53);
                        if ((auVar53 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          puVar29[uVar27 * 4 + -0x1c] = uVar17;
                        }
                        auVar65 = auVar64 & auVar83 | auVar65;
                        auVar53 = packssdw(auVar65,auVar65);
                        auVar5._8_4_ = 0xffffffff;
                        auVar5._0_8_ = 0xffffffffffffffff;
                        auVar5._12_4_ = 0xffffffff;
                        auVar53 = packssdw(auVar53 ^ auVar5,auVar53 ^ auVar5);
                        auVar53 = packsswb(auVar53,auVar53);
                        if ((auVar53._8_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x18] = uVar17;
                        }
                        auVar53 = (auVar34 | _DAT_00111160) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar53._0_4_);
                        auVar93._4_4_ = -(uint)(iVar20 < auVar53._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar53._8_4_);
                        auVar93._12_4_ = -(uint)(iVar30 < auVar53._12_4_);
                        auVar66._4_4_ = iVar87;
                        auVar66._0_4_ = iVar87;
                        auVar66._8_4_ = iVar94;
                        auVar66._12_4_ = iVar94;
                        auVar84._4_4_ = -(uint)(auVar53._4_4_ == iVar20);
                        auVar84._12_4_ = -(uint)(auVar53._12_4_ == iVar30);
                        auVar84._0_4_ = auVar84._4_4_;
                        auVar84._8_4_ = auVar84._12_4_;
                        auVar93._0_4_ = auVar93._4_4_;
                        auVar93._8_4_ = auVar93._12_4_;
                        auVar53 = auVar84 & auVar66 | auVar93;
                        auVar53 = packssdw(auVar53,auVar53);
                        auVar6._8_4_ = 0xffffffff;
                        auVar6._0_8_ = 0xffffffffffffffff;
                        auVar6._12_4_ = 0xffffffff;
                        auVar53 = packssdw(auVar53 ^ auVar6,auVar53 ^ auVar6);
                        auVar53 = packsswb(auVar53,auVar53);
                        if ((auVar53 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          puVar29[uVar27 * 4 + -0x14] = uVar17;
                        }
                        auVar57 = pshufhw(auVar66,auVar66,0x84);
                        auVar80 = pshufhw(auVar84,auVar84,0x84);
                        auVar58 = pshufhw(auVar57,auVar93,0x84);
                        auVar67._8_4_ = 0xffffffff;
                        auVar67._0_8_ = 0xffffffffffffffff;
                        auVar67._12_4_ = 0xffffffff;
                        auVar67 = (auVar58 | auVar80 & auVar57) ^ auVar67;
                        auVar57 = packssdw(auVar67,auVar67);
                        auVar57 = packsswb(auVar57,auVar57);
                        if ((auVar57._10_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -0x10] = uVar17;
                        }
                        auVar57 = (auVar34 | _DAT_00111150) ^ auVar104;
                        iVar87 = -(uint)(iVar19 < auVar57._0_4_);
                        auVar69._4_4_ = -(uint)(iVar20 < auVar57._4_4_);
                        iVar94 = -(uint)(iVar25 < auVar57._8_4_);
                        auVar69._12_4_ = -(uint)(iVar30 < auVar57._12_4_);
                        auVar85._4_4_ = iVar87;
                        auVar85._0_4_ = iVar87;
                        auVar85._8_4_ = iVar94;
                        auVar85._12_4_ = iVar94;
                        auVar53 = pshuflw(auVar53,auVar85,0xe8);
                        auVar68._4_4_ = -(uint)(auVar57._4_4_ == iVar20);
                        auVar68._12_4_ = -(uint)(auVar57._12_4_ == iVar30);
                        auVar68._0_4_ = auVar68._4_4_;
                        auVar68._8_4_ = auVar68._12_4_;
                        in_XMM6 = pshuflw(auVar103 & auVar37,auVar68,0xe8);
                        in_XMM6 = in_XMM6 & auVar53;
                        auVar69._0_4_ = auVar69._4_4_;
                        auVar69._8_4_ = auVar69._12_4_;
                        auVar37 = pshuflw(auVar53,auVar69,0xe8);
                        auVar101._8_4_ = 0xffffffff;
                        auVar101._0_8_ = 0xffffffffffffffff;
                        auVar101._12_4_ = 0xffffffff;
                        auVar101 = (auVar37 | in_XMM6) ^ auVar101;
                        auVar37 = packssdw(auVar101,auVar101);
                        in_XMM5 = packsswb(auVar37,auVar37);
                        if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          puVar29[uVar27 * 4 + -0xc] = uVar17;
                        }
                        auVar69 = auVar68 & auVar85 | auVar69;
                        auVar37 = packssdw(auVar69,auVar69);
                        auVar7._8_4_ = 0xffffffff;
                        auVar7._0_8_ = 0xffffffffffffffff;
                        auVar7._12_4_ = 0xffffffff;
                        auVar37 = packssdw(auVar37 ^ auVar7,auVar37 ^ auVar7);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37._12_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4 + -8] = uVar17;
                        }
                        auVar37 = (auVar34 | _DAT_00111140) ^ auVar104;
                        auVar86._0_4_ = -(uint)(iVar19 < auVar37._0_4_);
                        auVar86._4_4_ = -(uint)(iVar20 < auVar37._4_4_);
                        auVar86._8_4_ = -(uint)(iVar25 < auVar37._8_4_);
                        auVar86._12_4_ = -(uint)(iVar30 < auVar37._12_4_);
                        auVar70._4_4_ = auVar86._0_4_;
                        auVar70._0_4_ = auVar86._0_4_;
                        auVar70._8_4_ = auVar86._8_4_;
                        auVar70._12_4_ = auVar86._8_4_;
                        auVar35._4_4_ = -(uint)(auVar37._4_4_ == iVar20);
                        auVar35._12_4_ = -(uint)(auVar37._12_4_ == iVar30);
                        auVar35._0_4_ = auVar35._4_4_;
                        auVar35._8_4_ = auVar35._12_4_;
                        auVar38._4_4_ = auVar86._4_4_;
                        auVar38._0_4_ = auVar86._4_4_;
                        auVar38._8_4_ = auVar86._12_4_;
                        auVar38._12_4_ = auVar86._12_4_;
                        auVar37 = packssdw(auVar86,auVar35 & auVar70 | auVar38);
                        auVar8._8_4_ = 0xffffffff;
                        auVar8._0_8_ = 0xffffffffffffffff;
                        auVar8._12_4_ = 0xffffffff;
                        auVar37 = packssdw(auVar37 ^ auVar8,auVar37 ^ auVar8);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          puVar29[uVar27 * 4 + -4] = uVar17;
                        }
                        auVar103 = pshufhw(auVar70,auVar70,0x84);
                        auVar37 = pshufhw(auVar35,auVar35,0x84);
                        auVar53 = pshufhw(auVar38,auVar38,0x84);
                        auVar9._8_4_ = 0xffffffff;
                        auVar9._0_8_ = 0xffffffffffffffff;
                        auVar9._12_4_ = 0xffffffff;
                        auVar37 = packssdw(auVar37 & auVar103,
                                           (auVar53 | auVar37 & auVar103) ^ auVar9);
                        auVar37 = packsswb(auVar37,auVar37);
                        if ((auVar37._14_2_ >> 8 & 1) != 0) {
                          puVar29[uVar27 * 4] = uVar17;
                        }
                        uVar27 = uVar27 + 0x10;
                      } while ((uVar23 + 0xf & 0xfffffff0) != uVar27);
                    }
                    uVar26 = uVar26 + 1;
                    puVar29 = puVar29 + 1;
                  } while (uVar26 != 4);
                }
                if (((req_comp & 0xfffffffbU) == 0) ||
                   (local_78 = convert_format(local_78,4,req_comp,x_00,uVar18),
                   local_78 != (uchar *)0x0)) {
                  if (comp != (int *)0x0) {
                    *comp = uVar21;
                  }
                  *y = uVar18;
                  *x = x_00;
                  return local_78;
                }
              }
            }
            else {
              failure_reason = "PSD has an unknown compression format";
            }
          }
          else {
            failure_reason = "PSD is not in RGB color format";
          }
        }
        else {
          failure_reason = "PSD bit depth is not 8 bit";
        }
      }
      else {
        failure_reason = "Unsupported number of channels in PSD image";
      }
    }
    else {
      failure_reason = "Unsupported version of PSD image";
    }
  }
  else {
    failure_reason = "Corrupt PSD image";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *psd_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	int	pixelCount;
	int channelCount, compression;
	int channel, i, count, len;
   int w,h;
   uint8 *out;

	// Check identifier
	if (get32(s) != 0x38425053)	// "8BPS"
		return epuc("not PSD", "Corrupt PSD image");

	// Check file type version.
	if (get16(s) != 1)
		return epuc("wrong version", "Unsupported version of PSD image");

	// Skip 6 reserved bytes.
	skip(s, 6 );

	// Read the number of channels (R, G, B, A, etc).
	channelCount = get16(s);
	if (channelCount < 0 || channelCount > 16)
		return epuc("wrong channel count", "Unsupported number of channels in PSD image");

	// Read the rows and columns of the image.
   h = get32(s);
   w = get32(s);

	// Make sure the depth is 8 bits.
	if (get16(s) != 8)
		return epuc("unsupported bit depth", "PSD bit depth is not 8 bit");

	// Make sure the color mode is RGB.
	// Valid options are:
	//   0: Bitmap
	//   1: Grayscale
	//   2: Indexed color
	//   3: RGB color
	//   4: CMYK color
	//   7: Multichannel
	//   8: Duotone
	//   9: Lab color
	if (get16(s) != 3)
		return epuc("wrong color format", "PSD is not in RGB color format");

	// Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
	skip(s,get32(s) );

	// Skip the image resources.  (resolution, pen tool paths, etc)
	skip(s, get32(s) );

	// Skip the reserved data.
	skip(s, get32(s) );

	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	compression = get16(s);
	if (compression > 1)
		return epuc("bad compression", "PSD has an unknown compression format");

	// Create the destination image.
	out = (stbi_uc *) malloc(4 * w*h);
	if (!out) return epuc("outofmem", "Out of memory");
   pixelCount = w*h;

	// Initialize the data to zero.
	//memset( out, 0, pixelCount * 4 );

	// Finally, the image data.
	if (compression) {
		// RLE as used by .PSD and .TIFF
		// Loop until you get the number of unpacked bytes you are expecting:
		//     Read the next source byte into n.
		//     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
		//     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
		//     Else if n is 128, noop.
		// Endloop

		// The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
		// which we're going to just skip.
		skip(s, h * channelCount * 2 );

		// Read the RLE data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out+channel;
			if (channel >= channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = (channel == 3 ? 255 : 0), p += 4;
			} else {
				// Read the RLE data.
				count = 0;
				while (count < pixelCount) {
					len = get8(s);
					if (len == 128) {
						// No-op.
					} else if (len < 128) {
						// Copy next len+1 bytes literally.
						len++;
						count += len;
						while (len) {
							*p = get8(s);
                     p += 4;
							len--;
						}
					} else if (len > 128) {
						uint32	val;
						// Next -len+1 bytes in the dest are replicated from next source byte.
						// (Interpret len as a negative 8-bit int.)
						len ^= 0x0FF;
						len += 2;
                  val = get8(s);
						count += len;
						while (len) {
							*p = val;
                     p += 4;
							len--;
						}
					}
				}
			}
		}

	} else {
		// We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.

		// Read the data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out + channel;
			if (channel > channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = channel == 3 ? 255 : 0, p += 4;
			} else {
				// Read the data.
				count = 0;
				for (i = 0; i < pixelCount; i++)
					*p = get8(s), p += 4;
			}
		}
	}

	if (req_comp && req_comp != 4) {
		out = convert_format(out, 4, req_comp, w, h);
		if (out == NULL) return out; // convert_format frees input on failure
	}

	if (comp) *comp = channelCount;
	*y = h;
	*x = w;

	return out;
}